

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QTransform * __thiscall
QGraphicsViewPrivate::mapToViewTransform
          (QTransform *__return_storage_ptr__,QGraphicsViewPrivate *this,QGraphicsItem *item)

{
  long lVar1;
  QGraphicsView *this_00;
  QGraphicsItemPrivate *pQVar2;
  long lVar3;
  qreal *pqVar4;
  QTransform *pQVar5;
  QTransform *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  double dVar8;
  double dVar9;
  QTransform local_118;
  QTransform tr;
  QTransform move;
  
  bVar7 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  if ((*(uint *)&((item->d_ptr).d)->field_0x161 & 0x20000400) == 0) {
    dVar8 = 0.0;
    dVar9 = 0.0;
    do {
      pQVar2 = (item->d_ptr).d;
      if (pQVar2->transformData != (TransformData *)0x0) goto LAB_005baf89;
      dVar8 = dVar8 + (pQVar2->pos).xp;
      dVar9 = dVar9 + (pQVar2->pos).yp;
      item = pQVar2->parent;
    } while (item != (QGraphicsItem *)0x0);
    item = (QGraphicsItem *)0x0;
LAB_005baf89:
    pqVar4 = (qreal *)&DAT_0067b698;
    pQVar5 = &move;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pQVar5->m_matrix[0][0] = *pqVar4;
      pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
      pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    QTransform::fromTranslate(dVar8,dVar9);
    if (item == (QGraphicsItem *)0x0) {
      QTransform::translate((double)-this->scrollX,(double)-this->scrollY);
      if ((this->field_0x300 & 0x10) != 0) {
        pQVar5 = &move;
        pQVar6 = __return_storage_ptr__;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pQVar6->m_matrix[0][0] = pQVar5->m_matrix[0][0];
          pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          pQVar6 = (QTransform *)((long)pQVar6 + ((ulong)bVar7 * -2 + 1) * 8);
        }
        goto LAB_005bb097;
      }
      pQVar5 = &this->matrix;
    }
    else {
      pqVar4 = (qreal *)&DAT_0067b698;
      pQVar5 = &tr;
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pQVar5->m_matrix[0][0] = *pqVar4;
        pqVar4 = pqVar4 + (ulong)bVar7 * -2 + 1;
        pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      QGraphicsItem::sceneTransform(&tr,item);
      if ((this->field_0x300 & 0x10) == 0) {
        QTransform::operator*=(&tr,&this->matrix);
      }
      pQVar5 = &local_118;
      QTransform::operator*(pQVar5,&move);
      QTransform::fromTranslate((double)-this->scrollX,(double)-this->scrollY);
    }
    QTransform::operator*(__return_storage_ptr__,pQVar5);
  }
  else {
    QGraphicsView::viewportTransform(&move,this_00);
    QGraphicsItem::deviceTransform(__return_storage_ptr__,item,&move);
  }
LAB_005bb097:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform QGraphicsViewPrivate::mapToViewTransform(const QGraphicsItem *item) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    if (item->d_ptr->itemIsUntransformable())
        return item->deviceTransform(q->viewportTransform());

    // Translate-only
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = item;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QTransform move = QTransform::fromTranslate(offset.x(), offset.y());
    if (!parentItem) {
        move.translate(-scrollX, -scrollY);
        return identityMatrix ? move : matrix * move;
    }
    QTransform tr = parentItem->sceneTransform();
    if (!identityMatrix)
        tr *= matrix;
    return move * tr * QTransform::fromTranslate(-scrollX, -scrollY);
}